

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Maybe<kj::HttpMethod> __thiscall kj::consumeHttpMethod(kj *this,char **ptr)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  
  pbVar3 = (byte *)*ptr;
  if (*pbVar3 - 0x41 < 0x15) {
    pbVar1 = pbVar3 + 1;
    switch((uint)*pbVar3) {
    case 0x41:
      iVar4 = strncmp((char *)pbVar1,"CL",2);
      if (iVar4 == 0) {
        *ptr = (char *)(pbVar3 + 3);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 0x11;
        return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
      }
      break;
    case 0x43:
      if (pbVar3[1] == 0x4f) {
        iVar4 = strncmp((char *)(pbVar3 + 2),"PY",2);
        if (iVar4 == 0) {
          *ptr = (char *)(pbVar3 + 4);
          *this = (kj)0x1;
          *(undefined4 *)(this + 4) = 9;
          return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
        }
      }
      else if ((pbVar3[1] == 0x48) && (iVar4 = strncmp((char *)(pbVar3 + 2),"ECKOUT",6), iVar4 == 0)
              ) {
        *ptr = (char *)(pbVar3 + 8);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 0x14;
        return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
      }
      break;
    case 0x44:
      iVar4 = strncmp((char *)pbVar1,"ELETE",5);
      if (iVar4 == 0) {
        *ptr = (char *)(pbVar3 + 6);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 4;
        return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
      }
      break;
    case 0x47:
      iVar4 = strncmp((char *)pbVar1,"ET",2);
      if (iVar4 == 0) {
        *ptr = (char *)(pbVar3 + 3);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 0;
        return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
      }
      break;
    case 0x48:
      iVar4 = strncmp((char *)pbVar1,"EAD",3);
      if (iVar4 == 0) {
        *ptr = (char *)(pbVar3 + 4);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 1;
        return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
      }
      break;
    case 0x4c:
      iVar4 = strncmp((char *)pbVar1,"OCK",3);
      if (iVar4 == 0) {
        *ptr = (char *)(pbVar3 + 4);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 10;
        return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
      }
      break;
    case 0x4d:
      uVar5 = (int)(char)pbVar3[1] - 0x45U >> 1 |
              (uint)(((int)(char)pbVar3[1] - 0x45U & 1) != 0) << 0x1f;
      if (uVar5 < 8) {
        pbVar1 = pbVar3 + 2;
        switch(uVar5) {
        case 0:
          iVar4 = strncmp((char *)pbVar1,"RGE",3);
          if (iVar4 == 0) {
            *ptr = (char *)(pbVar3 + 5);
            *this = (kj)0x1;
            *(undefined4 *)(this + 4) = 0x15;
            return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
          }
          break;
        case 3:
          if (pbVar3[2] == 0x43) {
            iVar4 = strncmp((char *)(pbVar3 + 3),"OL",2);
            if (iVar4 == 0) {
              *ptr = (char *)(pbVar3 + 5);
              *this = (kj)0x1;
              *(undefined4 *)(this + 4) = 0xb;
              return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
            }
          }
          else if ((pbVar3[2] == 0x41) &&
                  (iVar4 = strncmp((char *)(pbVar3 + 3),"CTIVITY",7), iVar4 == 0)) {
            *ptr = (char *)(pbVar3 + 10);
            *this = (kj)0x1;
            *(undefined4 *)(this + 4) = 0x13;
            return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
          }
          break;
        case 5:
          iVar4 = strncmp((char *)pbVar1,"VE",2);
          if (iVar4 == 0) {
            *ptr = (char *)(pbVar3 + 4);
            *this = (kj)0x1;
            *(undefined4 *)(this + 4) = 0xc;
            return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
          }
          break;
        case 7:
          iVar4 = strncmp((char *)pbVar1,"EARCH",5);
          if (iVar4 == 0) {
            *ptr = (char *)(pbVar3 + 7);
            *this = (kj)0x1;
            *(undefined4 *)(this + 4) = 0x16;
            return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
          }
        }
      }
      break;
    case 0x4e:
      iVar4 = strncmp((char *)pbVar1,"OTIFY",5);
      if (iVar4 == 0) {
        *ptr = (char *)(pbVar3 + 6);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 0x17;
        return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
      }
      break;
    case 0x4f:
      iVar4 = strncmp((char *)pbVar1,"PTIONS",6);
      if (iVar4 == 0) {
        *ptr = (char *)(pbVar3 + 7);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 7;
        return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
      }
      break;
    case 0x50:
      pbVar1 = pbVar3 + 2;
      bVar2 = pbVar3[1];
      if (bVar2 < 0x52) {
        if (bVar2 == 0x41) {
          iVar4 = strncmp((char *)pbVar1,"TCH",3);
          if (iVar4 == 0) {
            *ptr = (char *)(pbVar3 + 5);
            *this = (kj)0x1;
            *(undefined4 *)(this + 4) = 5;
            return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
          }
        }
        else if ((bVar2 == 0x4f) && (iVar4 = strncmp((char *)pbVar1,"ST",2), iVar4 == 0)) {
          *ptr = (char *)(pbVar3 + 4);
          *this = (kj)0x1;
          *(undefined4 *)(this + 4) = 2;
          return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
        }
      }
      else if (bVar2 == 0x52) {
        if ((*pbVar1 == 0x4f) && (pbVar3[3] == 0x50)) {
          if (pbVar3[4] == 0x50) {
            iVar4 = strncmp((char *)(pbVar3 + 5),"ATCH",4);
            if (iVar4 == 0) {
              *ptr = (char *)(pbVar3 + 9);
              *this = (kj)0x1;
              *(undefined4 *)(this + 4) = 0xe;
              return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
            }
          }
          else if ((pbVar3[4] == 0x46) &&
                  (iVar4 = strncmp((char *)(pbVar3 + 5),"IND",3), iVar4 == 0)) {
            *ptr = (char *)(pbVar3 + 8);
            *this = (kj)0x1;
            *(undefined4 *)(this + 4) = 0xd;
            return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
          }
        }
      }
      else if (bVar2 == 0x55) {
        if (pbVar3[2] == 0x54) {
          *ptr = (char *)(pbVar3 + 3);
          *this = (kj)0x1;
          *(undefined4 *)(this + 4) = 3;
          return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
        }
        if ((pbVar3[2] == 0x52) && (iVar4 = strncmp((char *)(pbVar3 + 3),"GE",2), iVar4 == 0)) {
          *ptr = (char *)(pbVar3 + 5);
          *this = (kj)0x1;
          *(undefined4 *)(this + 4) = 6;
          return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
        }
      }
      break;
    case 0x52:
      iVar4 = strncmp((char *)pbVar1,"EPORT",5);
      if (iVar4 == 0) {
        *ptr = (char *)(pbVar3 + 6);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 0x12;
        return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
      }
      break;
    case 0x53:
      if (pbVar3[1] == 0x55) {
        iVar4 = strncmp((char *)(pbVar3 + 2),"BSCRIBE",7);
        if (iVar4 == 0) {
          *ptr = (char *)(pbVar3 + 9);
          *this = (kj)0x1;
          *(undefined4 *)(this + 4) = 0x18;
          return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
        }
      }
      else if ((pbVar3[1] == 0x45) && (iVar4 = strncmp((char *)(pbVar3 + 2),"ARCH",4), iVar4 == 0))
      {
        *ptr = (char *)(pbVar3 + 6);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 0xf;
        return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
      }
      break;
    case 0x54:
      iVar4 = strncmp((char *)pbVar1,"RACE",4);
      if (iVar4 == 0) {
        *ptr = (char *)(pbVar3 + 5);
        *this = (kj)0x1;
        *(undefined4 *)(this + 4) = 8;
        return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
      }
      break;
    case 0x55:
      if (*pbVar1 == 0x4e) {
        if (pbVar3[2] == 0x53) {
          iVar4 = strncmp((char *)(pbVar3 + 3),"UBSCRIBE",8);
          if (iVar4 == 0) {
            *ptr = (char *)(pbVar3 + 0xb);
            *this = (kj)0x1;
            *(undefined4 *)(this + 4) = 0x19;
            return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
          }
        }
        else if ((pbVar3[2] == 0x4c) && (iVar4 = strncmp((char *)(pbVar3 + 3),"OCK",3), iVar4 == 0))
        {
          *ptr = (char *)(pbVar3 + 6);
          *this = (kj)0x1;
          *(undefined4 *)(this + 4) = 0x10;
          return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
        }
      }
    }
  }
  *this = (kj)0x0;
  return (Maybe<kj::HttpMethod>)(NullableValue<kj::HttpMethod>)this;
}

Assistant:

static kj::Maybe<HttpMethod> consumeHttpMethod(char*& ptr) {
  char* p = ptr;

#define EXPECT_REST(prefix, suffix) \
  if (strncmp(p, #suffix, sizeof(#suffix)-1) == 0) { \
    ptr = p + (sizeof(#suffix)-1); \
    return HttpMethod::prefix##suffix; \
  } else { \
    return nullptr; \
  }

  switch (*p++) {
    case 'A': EXPECT_REST(A,CL)
    case 'C':
      switch (*p++) {
        case 'H': EXPECT_REST(CH,ECKOUT)
        case 'O': EXPECT_REST(CO,PY)
        default: return nullptr;
      }
    case 'D': EXPECT_REST(D,ELETE)
    case 'G': EXPECT_REST(G,ET)
    case 'H': EXPECT_REST(H,EAD)
    case 'L': EXPECT_REST(L,OCK)
    case 'M':
      switch (*p++) {
        case 'E': EXPECT_REST(ME,RGE)
        case 'K':
          switch (*p++) {
            case 'A': EXPECT_REST(MKA,CTIVITY)
            case 'C': EXPECT_REST(MKC,OL)
            default: return nullptr;
          }
        case 'O': EXPECT_REST(MO,VE)
        case 'S': EXPECT_REST(MS,EARCH)
        default: return nullptr;
      }
    case 'N': EXPECT_REST(N,OTIFY)
    case 'O': EXPECT_REST(O,PTIONS)
    case 'P':
      switch (*p++) {
        case 'A': EXPECT_REST(PA,TCH)
        case 'O': EXPECT_REST(PO,ST)
        case 'R':
          if (*p++ != 'O' || *p++ != 'P') return nullptr;
          switch (*p++) {
            case 'F': EXPECT_REST(PROPF,IND)
            case 'P': EXPECT_REST(PROPP,ATCH)
            default: return nullptr;
          }
        case 'U':
          switch (*p++) {
            case 'R': EXPECT_REST(PUR,GE)
            case 'T': EXPECT_REST(PUT,)
            default: return nullptr;
          }
        default: return nullptr;
      }
    case 'R': EXPECT_REST(R,EPORT)
    case 'S':
      switch (*p++) {
        case 'E': EXPECT_REST(SE,ARCH)
        case 'U': EXPECT_REST(SU,BSCRIBE)
        default: return nullptr;
      }
    case 'T': EXPECT_REST(T,RACE)
    case 'U':
      if (*p++ != 'N') return nullptr;
      switch (*p++) {
        case 'L': EXPECT_REST(UNL,OCK)
        case 'S': EXPECT_REST(UNS,UBSCRIBE)
        default: return nullptr;
      }
    default: return nullptr;
  }
#undef EXPECT_REST
}